

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_58494::ParserImpl::ParseBlock(ParserImpl *this)

{
  TokenDetail *pTVar1;
  undefined8 uVar2;
  ParseException *in_RSI;
  __uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> in_RDI;
  bool bVar3;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> statement;
  bool has_return;
  unique_ptr<luna::Block,_std::default_delete<luna::Block>_> block;
  pointer in_stack_ffffffffffffff68;
  ParserImpl *in_stack_ffffffffffffff70;
  TokenDetail *in_stack_ffffffffffffff78;
  TokenDetail *in_stack_ffffffffffffff80;
  ParserImpl *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  TokenDetail *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  operator_new(0x28);
  luna::Block::Block((Block *)in_stack_ffffffffffffff70);
  std::unique_ptr<luna::Block,std::default_delete<luna::Block>>::
  unique_ptr<std::default_delete<luna::Block>,void>
            ((unique_ptr<luna::Block,_std::default_delete<luna::Block>_> *)in_stack_ffffffffffffff70
             ,in_stack_ffffffffffffff68);
  in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 & 0xffffff;
  while( true ) {
    pTVar1 = LookAhead(in_stack_ffffffffffffff70);
    bVar3 = false;
    if (pTVar1->token_ != 0x11e) {
      pTVar1 = LookAhead(in_stack_ffffffffffffff70);
      bVar3 = false;
      if (pTVar1->token_ != 0x105) {
        in_stack_ffffffffffffff88 = (ParserImpl *)LookAhead(in_stack_ffffffffffffff70);
        bVar3 = false;
        if ((in_stack_ffffffffffffff88->current_).line_ != 0x113) {
          in_stack_ffffffffffffff80 = LookAhead(in_stack_ffffffffffffff70);
          bVar3 = false;
          if (in_stack_ffffffffffffff80->token_ != 0x104) {
            in_stack_ffffffffffffff78 = LookAhead(in_stack_ffffffffffffff70);
            bVar3 = in_stack_ffffffffffffff78->token_ != 0x103;
          }
        }
      }
    }
    if (!bVar3) break;
    if ((in_stack_ffffffffffffffd8 & 0x1000000) != 0) {
      uVar2 = __cxa_allocate_exception(0x20);
      luna::ParseException::ParseException
                (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
      __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
    }
    pTVar1 = LookAhead(in_stack_ffffffffffffff70);
    if (pTVar1->token_ == 0x110) {
      ParseReturnStatement
                ((ParserImpl *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      std::unique_ptr<luna::Block,_std::default_delete<luna::Block>_>::operator->
                ((unique_ptr<luna::Block,_std::default_delete<luna::Block>_> *)0x1d64b9);
      std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator=
                ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                 in_stack_ffffffffffffff70,
                 (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pTVar1);
      std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
                ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                 in_stack_ffffffffffffff80);
      in_stack_ffffffffffffffd8 = CONCAT13(1,(int3)in_stack_ffffffffffffffd8);
    }
    else {
      ParseStatement(in_stack_ffffffffffffff88);
      bVar3 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                         0x1d64f6);
      if (bVar3) {
        std::unique_ptr<luna::Block,_std::default_delete<luna::Block>_>::operator->
                  ((unique_ptr<luna::Block,_std::default_delete<luna::Block>_> *)0x1d6509);
        std::
        vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
        ::push_back((vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
                     *)in_stack_ffffffffffffff70,(value_type *)pTVar1);
      }
      std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
                ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                 in_stack_ffffffffffffff80);
    }
  }
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<luna::Block,std::default_delete<luna::Block>,void>
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_ffffffffffffff80,
             (unique_ptr<luna::Block,_std::default_delete<luna::Block>_> *)in_stack_ffffffffffffff78
            );
  std::unique_ptr<luna::Block,_std::default_delete<luna::Block>_>::~unique_ptr
            ((unique_ptr<luna::Block,_std::default_delete<luna::Block>_> *)in_stack_ffffffffffffff70
            );
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
         in_RDI.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
         .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseBlock()
        {
            std::unique_ptr<Block> block(new Block);

            bool has_return = false;
            while (LookAhead().token_ != Token_EOF &&
                   LookAhead().token_ != Token_End &&
                   LookAhead().token_ != Token_Until &&
                   LookAhead().token_ != Token_Elseif &&
                   LookAhead().token_ != Token_Else)
            {
                if (has_return)
                    throw ParseException("unexpect statement after return statement", look_ahead_);

                if (LookAhead().token_ == Token_Return)
                {
                    block->return_stmt_ = ParseReturnStatement();
                    has_return = true;
                }
                else
                {
                    std::unique_ptr<SyntaxTree> statement = ParseStatement();
                    if (statement)
                        block->statements_.push_back(std::move(statement));
                }
            }

            return std::move(block);
        }